

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshMapper.h
# Opt level: O2

void __thiscall
anurbs::MeshMapper<3L>::MeshMapper
          (MeshMapper<3L> *this,
          Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> *vertices,
          Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> *faces)

{
  RTree<3L> *this_00;
  CoeffReturnType CVar1;
  Index i;
  long row;
  Vector local_128;
  Vector local_108;
  Array<double,_3,_3,_1,_3,_3> *local_e8 [2];
  Vector box_b;
  Vector box_a;
  Array<double,_3,_3,_1,_3,_3> triangle;
  
  Eigen::Matrix<long,-1,3,1,-1,3>::
  Matrix<Eigen::Ref<Eigen::Matrix<long,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>>
            ((Matrix<long,_1,3,1,_1,3> *)this,faces);
  Eigen::Matrix<double,-1,3,1,-1,3>::
  Matrix<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>>
            ((Matrix<double,_1,3,1,_1,3> *)&this->m_vertices,vertices);
  this_00 = &this->m_rtree;
  RTree<3L>::RTree(this_00,(faces->
                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>
                           ).
                           super_MapBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
                           .m_rows.m_value,0x10);
  for (row = 0; row < (faces->
                      super_RefBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>
                      ).
                      super_MapBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
                      .m_rows.m_value; row = row + 1) {
    CVar1 = Eigen::
            DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<long,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_0>
            ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
                          *)faces,row,0);
    Eigen::
    Block<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_1,_3,_true>
    ::Block((Block<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_1,_3,_true>
             *)&box_a,vertices,CVar1);
    Eigen::internal::BlockImpl_dense<Eigen::Array<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Array<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true> *)&box_b
                    ,&triangle,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Array<double,3,3,1,3,3>,1,3,true>,Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>,1,3,true>>
              ((Block<Eigen::Array<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&box_b,
               (Block<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_1,_3,_true>
                *)&box_a);
    CVar1 = Eigen::
            DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<long,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_0>
            ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
                          *)faces,row,1);
    Eigen::
    Block<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_1,_3,_true>
    ::Block((Block<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_1,_3,_true>
             *)&box_a,vertices,CVar1);
    Eigen::internal::BlockImpl_dense<Eigen::Array<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Array<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true> *)&box_b
                    ,&triangle,1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Array<double,3,3,1,3,3>,1,3,true>,Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>,1,3,true>>
              ((Block<Eigen::Array<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&box_b,
               (Block<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_1,_3,_true>
                *)&box_a);
    CVar1 = Eigen::
            DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<long,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_0>
            ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
                          *)faces,row,2);
    Eigen::
    Block<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>,_1,_3,_true>
    ::Block((Block<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_1,_3,_true>
             *)&box_a,vertices,CVar1);
    Eigen::internal::BlockImpl_dense<Eigen::Array<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Array<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true> *)&box_b
                    ,&triangle,2);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Array<double,3,3,1,3,3>,1,3,true>,Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>,1,3,true>>
              ((Block<Eigen::Array<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&box_b,
               (Block<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_1,_3,_true>
                *)&box_a);
    box_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] =
         (double)&triangle;
    Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
    PlainObjectBase<Eigen::PartialReduxExpr<Eigen::Array<double,3,3,1,3,3>,Eigen::internal::member_minCoeff<double>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&box_a,
               (DenseBase<Eigen::PartialReduxExpr<Eigen::Array<double,_3,_3,_1,_3,_3>,_Eigen::internal::member_minCoeff<double>,_0>_>
                *)&box_b);
    local_e8[0] = &triangle;
    Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
    PlainObjectBase<Eigen::PartialReduxExpr<Eigen::Array<double,3,3,1,3,3>,Eigen::internal::member_maxCoeff<double>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&box_b,
               (DenseBase<Eigen::PartialReduxExpr<Eigen::Array<double,_3,_3,_1,_3,_3>,_Eigen::internal::member_maxCoeff<double>,_0>_>
                *)local_e8);
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
         = box_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
           [0];
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1]
         = box_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
           [1];
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2]
         = box_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
           [2];
    local_128.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
         = box_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
           [0];
    local_128.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1]
         = box_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
           [1];
    local_128.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2]
         = box_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
           [2];
    RTree<3L>::add(this_00,&local_108,&local_128);
  }
  RTree<3L>::finish(this_00,true);
  return;
}

Assistant:

MeshMapper(Eigen::Ref<const Vertices>& vertices, Eigen::Ref<const Faces>& faces)
        : m_vertices(vertices)
        , m_faces(faces)
        , m_rtree(faces.rows())
    {
        for (Index i = 0; i < faces.rows(); i++) {
            Eigen::Array<double, 3, TDimension> triangle;

            triangle.row(0) = vertices.row(faces(i, 0));
            triangle.row(1) = vertices.row(faces(i, 1));
            triangle.row(2) = vertices.row(faces(i, 2));

            Vector box_a = triangle.colwise().minCoeff();
            Vector box_b = triangle.colwise().maxCoeff();

            m_rtree.add(box_a, box_b);
        }

        m_rtree.finish(true);
    }